

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::clear_children_counters
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_ref t,size_t begin,size_t end)

{
  ulong uVar1;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *pbVar2;
  ulong uVar3;
  value_type vVar4;
  value_type vVar5;
  long lVar6;
  word_type local_80;
  word_type local_78;
  value_type local_68;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_60;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *local_48;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *local_40;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *local_38;
  
  uVar1 = this->degree;
  if (end < uVar1) {
    local_60._v = &(t.super_subtree_ref_base<false>._vector)->sizes;
    local_60._begin =
         (end - 1) +
         (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index;
    local_68 = item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
               ::value((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                        *)&local_60);
    uVar3 = this->degree;
  }
  else {
    local_68 = this->size;
    uVar3 = uVar1;
  }
  if (end < uVar3) {
    local_60._v = &(t.super_subtree_ref_base<false>._vector)->ranks;
    local_60._begin =
         (end - 1) +
         (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index;
    vVar4 = item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                     *)&local_60);
  }
  else {
    vVar4 = this->rank;
  }
  local_38 = this;
  if (begin == 0) {
    local_78 = 0;
    local_80 = 0;
  }
  else {
    local_60._v = &(t.super_subtree_ref_base<false>._vector)->sizes;
    local_60._begin =
         (begin - 1) +
         (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index;
    vVar5 = item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                     *)&local_60);
    local_78 = (word_type)(int)vVar5;
    local_60._v = &(t.super_subtree_ref_base<false>._vector)->ranks;
    local_60._begin =
         (begin - 1) +
         (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index;
    vVar5 = item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                     *)&local_60);
    local_80 = (word_type)(int)vVar5;
  }
  local_60._v = &(t.super_subtree_ref_base<false>._vector)->sizes;
  if (uVar1 < end) {
    end = uVar1;
  }
  lVar6 = (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index
  ;
  local_60._begin = lVar6 + begin;
  local_60._end = lVar6 + end;
  local_48 = local_60._v;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  ::operator=(&local_60,local_78);
  local_60._v = &(t.super_subtree_ref_base<false>._vector)->ranks;
  lVar6 = (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index
  ;
  local_60._begin = begin + lVar6;
  local_60._end = lVar6 + end;
  local_40 = local_60._v;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  ::operator=(&local_60,local_80);
  pbVar2 = local_38;
  lVar6 = (t.super_subtree_ref_base<false>._vector)->degree * t.super_subtree_ref_base<false>._index
  ;
  local_60._begin = lVar6 + end;
  local_60._end = lVar6 + local_38->degree;
  local_60._v = local_48;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  ::operator-=(&local_60,local_68 - local_78);
  lVar6 = t.super_subtree_ref_base<false>._index * (t.super_subtree_ref_base<false>._vector)->degree
  ;
  local_60._begin = end + lVar6;
  local_60._end = lVar6 + pbVar2->degree;
  local_60._v = local_40;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  ::operator-=(&local_60,vVar4 - local_80);
  return;
}

Assistant:

void bt_impl<W, AP>::clear_children_counters(subtree_ref t,
                                                     size_t begin,
                                                     size_t end) const
        {
            size_t keys_end = min(end, degree);
            size_t last_size = end < degree ? t.sizes(end - 1)   : size;
            size_t last_rank = end < degree ? t.ranks(end - 1)   : rank;
            size_t prev_size = begin > 0    ? t.sizes(begin - 1) : 0;
            size_t prev_rank = begin > 0    ? t.ranks(begin - 1) : 0;
            
            assert(last_size >= prev_size);
            assert(last_rank >= prev_rank);
            
            t.sizes(begin, keys_end)   = prev_size;
            t.ranks(begin, keys_end)   = prev_rank;
            
            t.sizes(keys_end, degree) -= last_size - prev_size;
            t.ranks(keys_end, degree) -= last_rank - prev_rank;
        }